

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowLabelTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = p->nTravIds;
  if (pObj->TravId != iVar1) {
    do {
      pObj->TravId = iVar1;
      uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
      uVar3 = uVar2 & 7;
      if (uVar3 == 2) {
        return;
      }
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      if (uVar3 == 1) {
        return;
      }
      if ((uVar2 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                      ,0x265,"void Llb_ManFlowLabelTfi_rec(Aig_Man_t *, Aig_Obj_t *)");
      }
      Llb_ManFlowLabelTfi_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      iVar1 = p->nTravIds;
    } while (pObj->TravId != iVar1);
  }
  return;
}

Assistant:

void Llb_ManFlowLabelTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) );
    Llb_ManFlowLabelTfi_rec( p, Aig_ObjFanin0(pObj) );
    Llb_ManFlowLabelTfi_rec( p, Aig_ObjFanin1(pObj) );
}